

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool AES_CCM_Encrypt(COSE_Enveloped *pcose,int TSize,int LSize,byte *pbKey,size_t cbKey,
                     byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  _Bool _Var1;
  int iVar2;
  cose_error cVar3;
  int iVar4;
  cn_cbor *pcVar5;
  cn_cbor_errback local_138;
  cn_cbor_errback cbor_error;
  byte *pbIV;
  byte rgbIV [16];
  cn_cbor *pcStack_110;
  mbedtls_cipher_id_t cipher;
  cn_cbor *cnTmp;
  cn_cbor *cbor_iv_t;
  cn_cbor *cbor_iv;
  uint8_t *puStack_f0;
  int NSize;
  byte *rgbOut;
  undefined1 local_e0 [4];
  int cbOut;
  mbedtls_ccm_context ctx;
  byte *pbAuthData_local;
  size_t cbKey_local;
  byte *pbKey_local;
  int LSize_local;
  int TSize_local;
  COSE_Enveloped *pcose_local;
  
  puStack_f0 = (uint8_t *)0x0;
  iVar2 = 0xf - LSize / 8;
  cnTmp = (cn_cbor *)0x0;
  pcStack_110 = (cn_cbor *)0x0;
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  ctx._152_8_ = pbAuthData;
  mbedtls_ccm_init((mbedtls_ccm_context *)local_e0);
  rgbIV[0xc] = '\x02';
  rgbIV[0xd] = '\0';
  rgbIV[0xe] = '\0';
  rgbIV[0xf] = '\0';
  pcVar5 = _COSE_map_get_int(&pcose->m_message,5,7,perr);
  if (pcVar5 == (cn_cbor *)0x0) {
    cbor_error = (cn_cbor_errback)calloc((long)iVar2,1);
    if (cbor_error == (cn_cbor_errback)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
      goto LAB_00261e1e;
    }
    rand_bytes((byte *)cbor_error,(long)iVar2);
    memcpy(&pbIV,(void *)cbor_error,(long)iVar2);
    cnTmp = cn_cbor_data_create((uint8_t *)cbor_error,iVar2,&local_138);
    if (cnTmp == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        cVar3 = _MapFromCBOR(local_138);
        perr->err = cVar3;
      }
      goto LAB_00261e1e;
    }
    cbor_error.pos = 0;
    cbor_error.err = CN_CBOR_NO_ERROR;
    _Var1 = _COSE_map_put(&pcose->m_message,5,cnTmp,2,perr);
    if (!_Var1) goto LAB_00261e1e;
  }
  else {
    if (pcVar5->type != CN_CBOR_BYTES) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_00261e1e;
    }
    if (pcVar5->length != iVar2) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_00261e1e;
    }
    memcpy(&pbIV,(pcVar5->v).bytes,(long)pcVar5->length);
  }
  cnTmp = (cn_cbor *)0x0;
  iVar4 = mbedtls_ccm_setkey((mbedtls_ccm_context *)local_e0,rgbIV._12_4_,pbKey,(uint)(cbKey << 3));
  if (iVar4 == 0) {
    iVar4 = TSize / 8;
    puStack_f0 = (uint8_t *)calloc((long)((int)pcose->cbContent + iVar4),1);
    if (puStack_f0 == (uint8_t *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
    }
    else {
      iVar2 = mbedtls_ccm_encrypt_and_tag
                        ((mbedtls_ccm_context *)local_e0,pcose->cbContent,(uchar *)&pbIV,(long)iVar2
                         ,(uchar *)ctx._152_8_,cbAuthData,pcose->pbContent,puStack_f0,
                         puStack_f0 + pcose->cbContent,(long)iVar4);
      if (iVar2 == 0) {
        pcStack_110 = cn_cbor_data_create(puStack_f0,(int)pcose->cbContent + iVar4,
                                          (cn_cbor_errback *)0x0);
        if (pcStack_110 == (cn_cbor *)0x0) {
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_CBOR;
          }
        }
        else {
          puStack_f0 = (uint8_t *)0x0;
          _Var1 = _COSE_array_replace(&pcose->m_message,pcStack_110,2,(cn_cbor_errback *)0x0);
          if (_Var1) {
            mbedtls_ccm_free((mbedtls_ccm_context *)local_e0);
            return true;
          }
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_CBOR;
          }
        }
      }
      else if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_CRYPTO_FAIL;
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_CRYPTO_FAIL;
  }
LAB_00261e1e:
  if (cbor_error != (cn_cbor_errback)0x0) {
    free((void *)cbor_error);
  }
  if (cnTmp != (cn_cbor *)0x0) {
    free(cnTmp);
  }
  if (puStack_f0 != (uint8_t *)0x0) {
    free(puStack_f0);
  }
  if (pcStack_110 != (cn_cbor *)0x0) {
    free(pcStack_110);
  }
  mbedtls_ccm_free((mbedtls_ccm_context *)local_e0);
  return false;
}

Assistant:

bool AES_CCM_Encrypt(COSE_Enveloped * pcose, int TSize, int LSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_ccm_context ctx;
	int cbOut;
	byte * rgbOut = NULL;
	int NSize = 15 - (LSize/8);
	const cn_cbor * cbor_iv = NULL;
	cn_cbor * cbor_iv_t = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif
	cn_cbor * cnTmp = NULL;
	mbedtls_cipher_id_t cipher;
	byte rgbIV[16];
	byte * pbIV = NULL;
	cn_cbor_errback cbor_error;

        mbedtls_ccm_init(&ctx);

	cipher = MBEDTLS_CIPHER_ID_AES;			
	
	//  Setup the IV/Nonce and put it into the message
	cbor_iv = _COSE_map_get_int(&pcose->m_message, COSE_Header_IV, COSE_BOTH, perr);
	if (cbor_iv == NULL) {
	
                pbIV = COSE_CALLOC(NSize, 1, context);
		CHECK_CONDITION(pbIV != NULL, COSE_ERR_OUT_OF_MEMORY);
		rand_bytes(pbIV, NSize);
		memcpy(rgbIV, pbIV, NSize);
		cbor_iv_t = cn_cbor_data_create(pbIV, NSize, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cbor_iv_t != NULL, cbor_error);
		pbIV = NULL;

		if (!_COSE_map_put(&pcose->m_message, COSE_Header_IV, cbor_iv_t, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cbor_iv_t = NULL;
	}
	else {
		CHECK_CONDITION(cbor_iv->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(cbor_iv->length == NSize, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbIV, cbor_iv->v.str, cbor_iv->length);
	}

	//  Setup and run the mbedTLS code
	
	//cbKey comes in bytes not bits
 	CHECK_CONDITION(!mbedtls_ccm_setkey(&ctx, cipher, pbKey, cbKey*8), COSE_ERR_CRYPTO_FAIL);
	
	TSize /= 8; // Comes in in bits not bytes.

        cbOut = pcose->cbContent; // M00BUG - This is a missing call?
	rgbOut = (byte *)COSE_CALLOC(cbOut+TSize, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!mbedtls_ccm_encrypt_and_tag(&ctx, pcose->cbContent, rgbIV, NSize, pbAuthData, cbAuthData, pcose->pbContent, rgbOut, &rgbOut[pcose->cbContent], TSize), COSE_ERR_CRYPTO_FAIL);	

	cnTmp = cn_cbor_data_create(rgbOut, (int)pcose->cbContent + TSize, CBOR_CONTEXT_PARAM_COMMA NULL);
	CHECK_CONDITION(cnTmp != NULL, COSE_ERR_CBOR);
	rgbOut = NULL;

	CHECK_CONDITION(_COSE_array_replace(&pcose->m_message, cnTmp, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);
	cnTmp = NULL;

	mbedtls_ccm_free(&ctx);
	
	return true;

errorReturn:
	if (pbIV != NULL) COSE_FREE(pbIV, context);
	if (cbor_iv_t != NULL) COSE_FREE(cbor_iv_t, context);
	if (rgbOut != NULL) COSE_FREE(rgbOut, context);
	if (cnTmp != NULL) COSE_FREE(cnTmp, context);
	mbedtls_ccm_free(&ctx);
	return false;
}